

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_discover.cc
# Opt level: O0

void printHelp(ostream *os,string *command)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  allocator<char> *__a;
  string *in_RSI;
  ostream *in_RDI;
  int padding;
  int min_padding;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>
  *cmd;
  const_iterator __end1;
  const_iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
  *__range1;
  int max_command_len;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int iVar4;
  ostream *in_stack_ffffffffffffff70;
  char __c;
  size_type in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_61;
  string local_60 [32];
  int local_40;
  undefined4 local_3c;
  reference local_38;
  _Self local_30;
  _Self local_28;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
  *local_20;
  int local_14;
  string *local_10;
  ostream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::operator<<(in_RDI,"Usage: ");
  poVar3 = std::operator<<(local_8,local_10);
  std::operator<<(poVar3," <operation> [<args>]\n");
  std::operator<<(local_8,'\n');
  std::operator<<(local_8,"Available operations are:\n");
  local_14 = getMaxCommandLen<std::__cxx11::string,ResetCommand>
                       ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
                         *)in_stack_ffffffffffffff90);
  local_20 = &reset_commands_abi_cxx11_;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
                *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
              *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  while( true ) {
    bVar1 = std::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    local_38 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
               ::operator*((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                            *)in_stack_ffffffffffffff70);
    local_3c = 3;
    iVar4 = local_14;
    iVar2 = std::__cxx11::string::length();
    local_40 = (iVar4 - iVar2) + 3;
    poVar3 = std::operator<<(local_8,"    ");
    std::operator<<(poVar3,(string *)local_38);
    __a = (allocator<char> *)(long)local_40;
    __c = (char)((ulong)&local_61 >> 0x38);
    in_stack_ffffffffffffff70 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,__c,__a);
    std::operator<<(in_stack_ffffffffffffff70,local_60);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator(&local_61);
    poVar3 = std::operator<<(local_8,(string *)&local_38->second);
    std::operator<<(poVar3,'\n');
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>
                  *)in_stack_ffffffffffffff70);
  }
  std::operator<<(local_8,'\n');
  std::operator<<(local_8,"Available arguments are:\n");
  std::operator<<(local_8,"    -h, --help         Show this help and exit\n");
  std::operator<<(local_8,"    -f name=<name>     Filter by name\n");
  std::operator<<(local_8,"    -f serial=<serial> Filter by serial number\n");
  std::operator<<(local_8,"    -f mac=<mac>       Filter by MAC address\n");
  std::operator<<(local_8,"    -f iface=<mac>     Filter by interface name\n");
  std::operator<<(local_8,"    -f model=<model>   Filter by model name\n");
  std::operator<<(local_8,"    -y                 Assume \'yes\' for all queries\n");
  return;
}

Assistant:

static void printHelp(std::ostream &os, const std::string &command)
{
  os << command << " [<args>]\n";
  os << '\n';
  os << "-h, --help         Show this help and exit\n";
  os << "-f name=<name>     Filter by name\n";
  os << "-f serial=<serial> Filter by serial number\n";
  os << "-f mac=<mac>       Filter by MAC address\n";
  os << "-f iface=<mac>     Filter by interface name\n";
  os << "-f model=<model>   Filter by model name\n";
  os << "--iponly           Show only the IP addresses of discovered sensors\n";
  os << "--serialonly       Show only the serial number of discovered sensors\n";
}